

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastpack19(uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  
  uVar1 = in[1];
  *out = (uint)uVar1 << 0x13 | (uint)*in & 0x7ffff;
  out[1] = ((uint)in[2] & 0x7ffff) << 6 | (uint)uVar1 >> 0xd & 0x3f;
  Unroller<(unsigned_short)19,_(unsigned_short)3>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack19(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<19>::Pack(in, out);
}